

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testThreads.c
# Opt level: O0

int main(void)

{
  void *local_20;
  void *result;
  int ret;
  uint repeat;
  uint i;
  
  repeat = 0;
  xmlInitParser();
  result._4_4_ = 0;
  do {
    if (499 < result._4_4_) {
      xmlCleanupParser();
      xmlMemoryDump();
      return 0;
    }
    xmlLoadCatalog(catalog);
    memset(tid,0xff,0x38);
    for (ret = 0; (uint)ret < 7; ret = ret + 1) {
      result._0_4_ = pthread_create(tid + (uint)ret,(pthread_attr_t *)0x0,thread_specific_data,
                                    threadParams + (uint)ret);
      if ((int)result != 0) {
        perror("pthread_create");
        exit(1);
      }
      result._0_4_ = 0;
    }
    for (ret = 0; (uint)ret < 7; ret = ret + 1) {
      result._0_4_ = pthread_join(tid[(uint)ret],&local_20);
      if ((int)result != 0) {
        perror("pthread_join");
        exit(1);
      }
      result._0_4_ = 0;
    }
    xmlCatalogCleanup();
    for (ret = 0; (uint)ret < 7; ret = ret + 1) {
      if (threadParams[(uint)ret].okay == 0) {
        printf("Thread %d handling %s failed\n",(ulong)(uint)ret,threadParams[(uint)ret].filename);
      }
    }
    result._4_4_ = result._4_4_ + 1;
  } while( true );
}

Assistant:

int
main(void)
{
    unsigned int i, repeat;
    int ret;

    xmlInitParser();
    for (repeat = 0;repeat < TEST_REPEAT_COUNT;repeat++) {
	xmlLoadCatalog(catalog);

        memset(tid, 0xff, sizeof(*tid)*num_threads);

	for (i = 0; i < num_threads; i++) {
	    ret = pthread_create(&tid[i], NULL, thread_specific_data,
				 (void *) &threadParams[i]);
	    if (ret != 0) {
		perror("pthread_create");
		exit(1);
	    }
	}
	for (i = 0; i < num_threads; i++) {
            void *result;
	    ret = pthread_join(tid[i], &result);
	    if (ret != 0) {
		perror("pthread_join");
		exit(1);
	    }
	}

	xmlCatalogCleanup();
	for (i = 0; i < num_threads; i++)
	    if (threadParams[i].okay == 0)
		printf("Thread %d handling %s failed\n", i,
                       threadParams[i].filename);
    }
    xmlCleanupParser();
    xmlMemoryDump();
    return (0);
}